

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

uint8_t * nn_sha1_result(nn_sha1 *self)

{
  uint uVar1;
  long lVar2;
  uint8_t data;
  
  data = 0x80;
  while( true ) {
    nn_sha1_add(self,data);
    if (self->buffer_offset == '8') break;
    data = '\0';
  }
  nn_sha1_add(self,'\0');
  nn_sha1_add(self,'\0');
  nn_sha1_add(self,'\0');
  nn_sha1_add(self,(byte)(self->bytes_hashed >> 0x1d));
  nn_sha1_add(self,(uint8_t)(self->bytes_hashed >> 0x15));
  nn_sha1_add(self,(uint8_t)(self->bytes_hashed >> 0xd));
  nn_sha1_add(self,(uint8_t)(self->bytes_hashed >> 5));
  nn_sha1_add(self,(char)self->bytes_hashed << 3);
  if (self->is_little_endian != '\0') {
    lVar2 = 0;
    do {
      uVar1 = self->state[lVar2];
      self->state[lVar2] =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
  }
  return (uint8_t *)self->state;
}

Assistant:

uint8_t* nn_sha1_result (struct nn_sha1 *self)
{
    int i;

    /*  Pad to complete the last block. */
    nn_sha1_add (self, 0x80);

    while (self->buffer_offset != 56)
        nn_sha1_add (self, 0x00);

    /*  Append length in the last 8 bytes. SHA-1 supports 64-bit hashes, so
        zero-pad the top bits. Shifting to multiply by 8 as SHA-1 supports
        bit- as well as byte-streams. */
    nn_sha1_add (self, 0);
    nn_sha1_add (self, 0);
    nn_sha1_add (self, 0);
    nn_sha1_add (self, self->bytes_hashed >> 29);
    nn_sha1_add (self, self->bytes_hashed >> 21);
    nn_sha1_add (self, self->bytes_hashed >> 13);
    nn_sha1_add (self, self->bytes_hashed >> 5);
    nn_sha1_add (self, self->bytes_hashed << 3);

    /*  Correct byte order for little-endian systems. */
    if (self->is_little_endian) {
        for (i = 0; i < 5; i++) {
            self->state [i] =
                (((self->state [i]) << 24) & 0xFF000000) |
                (((self->state [i]) << 8) & 0x00FF0000) |
                (((self->state [i]) >> 8) & 0x0000FF00) |
                (((self->state [i]) >> 24) & 0x000000FF);
        }
    }

    /* 20-octet pointer to hash. */
    return (uint8_t*) self->state;
}